

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddUnate.c
# Opt level: O0

DdNode * extraZddUnateInfoCompute(DdManager *dd,DdNode *bFunc,DdNode *bVars)

{
  int iVar1;
  int iVar2;
  DdNode *pDVar3;
  DdNode *pDVar4;
  DdNode *pDVar5;
  int local_7c;
  int AddVar;
  int LevelF;
  int nVarsExtra;
  DdNode *bVarsNew;
  DdNode *bF1;
  DdNode *bF0;
  DdNode *zPlus;
  DdNode *zTemp;
  DdNode *zRes1;
  DdNode *zRes0;
  DdNode *bFR;
  DdNode *zRes;
  DdNode *bVars_local;
  DdNode *bFunc_local;
  DdManager *dd_local;
  
  pDVar3 = (DdNode *)((ulong)bFunc & 0xfffffffffffffffe);
  if (pDVar3->index == 0x7fffffff) {
    if (bVars->index == 0x7fffffff) {
      dd_local = (DdManager *)dd->zero;
    }
    else {
      dd_local = (DdManager *)extraZddGetSingletonsBoth(dd,bVars);
    }
  }
  else {
    if (bVars == dd->one) {
      __assert_fail("bVars != b1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/extrab/extraBddUnate.c"
                    ,399,"DdNode *extraZddUnateInfoCompute(DdManager *, DdNode *, DdNode *)");
    }
    dd_local = (DdManager *)cuddCacheLookup2Zdd(dd,extraZddUnateInfoCompute,bFunc,bVars);
    if (dd_local == (DdManager *)0x0) {
      iVar1 = dd->perm[pDVar3->index];
      _LevelF = bVars;
      while (dd->perm[_LevelF->index] < iVar1) {
        _LevelF = (_LevelF->type).kids.T;
      }
      if (pDVar3->index != _LevelF->index) {
        __assert_fail("bFR->index == bVarsNew->index",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/extrab/extraBddUnate.c"
                      ,0x1a5,"DdNode *extraZddUnateInfoCompute(DdManager *, DdNode *, DdNode *)");
      }
      if (pDVar3 == bFunc) {
        bF1 = (pDVar3->type).kids.E;
        bVarsNew = (pDVar3->type).kids.T;
      }
      else {
        bF1 = (DdNode *)((ulong)(pDVar3->type).kids.E ^ 1);
        bVarsNew = (DdNode *)((ulong)(pDVar3->type).kids.T ^ 1);
      }
      bFR = extraZddUnateInfoCompute(dd,bF1,(_LevelF->type).kids.T);
      if (bFR == (DdNode *)0x0) {
        dd_local = (DdManager *)0x0;
      }
      else {
        *(int *)(((ulong)bFR & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)bFR & 0xfffffffffffffffe) + 4) + 1;
        if (bFR != dd->zero) {
          pDVar5 = extraZddUnateInfoCompute(dd,bVarsNew,(_LevelF->type).kids.T);
          if (pDVar5 == (DdNode *)0x0) {
            Cudd_RecursiveDerefZdd(dd,bFR);
            return (DdNode *)0x0;
          }
          *(int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4) + 1;
          pDVar4 = cuddZddIntersect(dd,bFR,pDVar5);
          if (pDVar4 == (DdNode *)0x0) {
            Cudd_RecursiveDerefZdd(dd,bFR);
            Cudd_RecursiveDerefZdd(dd,pDVar5);
            return (DdNode *)0x0;
          }
          *(int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4) + 1;
          Cudd_RecursiveDerefZdd(dd,bFR);
          Cudd_RecursiveDerefZdd(dd,pDVar5);
          bFR = pDVar4;
        }
        local_7c = -1;
        iVar2 = Cudd_bddLeq(dd,bF1,bVarsNew);
        if (iVar2 == 0) {
          iVar2 = Cudd_bddLeq(dd,bVarsNew,bF1);
          if (iVar2 != 0) {
            local_7c = 1;
          }
        }
        else {
          local_7c = 0;
        }
        _LevelF = bVars;
        if (-1 < local_7c) {
          pDVar3 = cuddZddGetNode(dd,pDVar3->index * 2 + local_7c,dd->one,dd->zero);
          if (pDVar3 == (DdNode *)0x0) {
            Cudd_RecursiveDerefZdd(dd,bFR);
            return (DdNode *)0x0;
          }
          *(int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4) + 1;
          pDVar5 = cuddZddUnion(dd,bFR,pDVar3);
          if (pDVar5 == (DdNode *)0x0) {
            Cudd_RecursiveDerefZdd(dd,bFR);
            Cudd_RecursiveDerefZdd(dd,pDVar3);
            return (DdNode *)0x0;
          }
          *(int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4) + 1;
          Cudd_RecursiveDerefZdd(dd,bFR);
          Cudd_RecursiveDerefZdd(dd,pDVar3);
          bFR = pDVar5;
        }
        while (dd->perm[_LevelF->index] < iVar1) {
          pDVar3 = cuddZddGetNode(dd,_LevelF->index * 2 + 1,dd->one,dd->zero);
          if (pDVar3 == (DdNode *)0x0) {
            Cudd_RecursiveDerefZdd(dd,bFR);
            return (DdNode *)0x0;
          }
          *(int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4) + 1;
          pDVar5 = cuddZddUnion(dd,bFR,pDVar3);
          if (pDVar5 == (DdNode *)0x0) {
            Cudd_RecursiveDerefZdd(dd,bFR);
            Cudd_RecursiveDerefZdd(dd,pDVar3);
            return (DdNode *)0x0;
          }
          *(int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4) + 1;
          Cudd_RecursiveDerefZdd(dd,bFR);
          Cudd_RecursiveDerefZdd(dd,pDVar3);
          pDVar3 = cuddZddGetNode(dd,_LevelF->index << 1,dd->one,dd->zero);
          if (pDVar3 == (DdNode *)0x0) {
            Cudd_RecursiveDerefZdd(dd,pDVar5);
            return (DdNode *)0x0;
          }
          *(int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4) + 1;
          bFR = cuddZddUnion(dd,pDVar5,pDVar3);
          if (bFR == (DdNode *)0x0) {
            Cudd_RecursiveDerefZdd(dd,pDVar5);
            Cudd_RecursiveDerefZdd(dd,pDVar3);
            return (DdNode *)0x0;
          }
          *(int *)(((ulong)bFR & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)bFR & 0xfffffffffffffffe) + 4) + 1;
          Cudd_RecursiveDerefZdd(dd,pDVar5);
          Cudd_RecursiveDerefZdd(dd,pDVar3);
          _LevelF = (_LevelF->type).kids.T;
        }
        *(int *)(((ulong)bFR & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)bFR & 0xfffffffffffffffe) + 4) + -1;
        cuddCacheInsert2(dd,extraZddUnateInfoCompute,bFunc,bVars,bFR);
        dd_local = (DdManager *)bFR;
      }
    }
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode * 
extraZddUnateInfoCompute( 
  DdManager * dd,   /* the manager */
  DdNode * bFunc,   /* the function whose symmetries are computed */
  DdNode * bVars )  /* the set of variables on which this function depends */
{
    DdNode * zRes;
    DdNode * bFR = Cudd_Regular(bFunc); 

    if ( cuddIsConstant(bFR) )
    {
        if ( cuddIsConstant(bVars) )
            return z0;
        return extraZddGetSingletonsBoth( dd, bVars );
    }
    assert( bVars != b1 );

    if ( (zRes = cuddCacheLookup2Zdd(dd, extraZddUnateInfoCompute, bFunc, bVars)) )
        return zRes;
    else
    {
        DdNode * zRes0, * zRes1;
        DdNode * zTemp, * zPlus;             
        DdNode * bF0, * bF1;             
        DdNode * bVarsNew;
        int nVarsExtra;
        int LevelF;
        int AddVar;

        // every variable in bF should be also in bVars, therefore LevelF cannot be above LevelV
        // if LevelF is below LevelV, scroll through the vars in bVars to the same level as F
        // count how many extra vars are there in bVars
        nVarsExtra = 0;
        LevelF = dd->perm[bFR->index];
        for ( bVarsNew = bVars; LevelF > dd->perm[bVarsNew->index]; bVarsNew = cuddT(bVarsNew) )
            nVarsExtra++; 
        // the indexes (level) of variables should be synchronized now
        assert( bFR->index == bVarsNew->index );

        // cofactor the function
        if ( bFR != bFunc ) // bFunc is complemented 
        {
            bF0 = Cudd_Not( cuddE(bFR) );
            bF1 = Cudd_Not( cuddT(bFR) );
        }
        else
        {
            bF0 = cuddE(bFR);
            bF1 = cuddT(bFR);
        }

        // solve subproblems
        zRes0 = extraZddUnateInfoCompute( dd, bF0, cuddT(bVarsNew) );
        if ( zRes0 == NULL )
            return NULL;
        cuddRef( zRes0 );

        // if there is no symmetries in the negative cofactor
        // there is no need to test the positive cofactor
        if ( zRes0 == z0 )
            zRes = zRes0;  // zRes takes reference
        else
        {
            zRes1 = extraZddUnateInfoCompute( dd, bF1, cuddT(bVarsNew) );
            if ( zRes1 == NULL )
            {
                Cudd_RecursiveDerefZdd( dd, zRes0 );
                return NULL;
            }
            cuddRef( zRes1 );

            // only those variables are pair-wise symmetric 
            // that are pair-wise symmetric in both cofactors
            // therefore, intersect the solutions
            zRes = cuddZddIntersect( dd, zRes0, zRes1 );
            if ( zRes == NULL )
            {
                Cudd_RecursiveDerefZdd( dd, zRes0 );
                Cudd_RecursiveDerefZdd( dd, zRes1 );
                return NULL;
            }
            cuddRef( zRes );
            Cudd_RecursiveDerefZdd( dd, zRes0 );
            Cudd_RecursiveDerefZdd( dd, zRes1 );
        }

        // consider the current top-most variable
        AddVar = -1;
        if ( Cudd_bddLeq( dd, bF0, bF1 ) ) // pos
            AddVar = 0;
        else if ( Cudd_bddLeq( dd, bF1, bF0 ) ) // neg
            AddVar = 1;
        if ( AddVar >= 0 )
        {
            // create the singleton
            zPlus = cuddZddGetNode( dd, 2*bFR->index + AddVar, z1, z0 );
            if ( zPlus == NULL ) 
            {
                Cudd_RecursiveDerefZdd( dd, zRes );
                return NULL;
            }
            cuddRef( zPlus );

            // add these to the result
            zRes = cuddZddUnion( dd, zTemp = zRes, zPlus );
            if ( zRes == NULL )
            {
                Cudd_RecursiveDerefZdd( dd, zTemp );
                Cudd_RecursiveDerefZdd( dd, zPlus );
                return NULL;
            }
            cuddRef( zRes );
            Cudd_RecursiveDerefZdd( dd, zTemp );
            Cudd_RecursiveDerefZdd( dd, zPlus );
        }
        // only zRes is referenced at this point

        // if we skipped some variables, these variables cannot be symmetric with
        // any variables that are currently in the support of bF, but they can be 
        // symmetric with the variables that are in bVars but not in the support of bF
        for ( bVarsNew = bVars; LevelF > dd->perm[bVarsNew->index]; bVarsNew = cuddT(bVarsNew) )
        {
            // create the negative singleton
            zPlus = cuddZddGetNode( dd, 2*bVarsNew->index+1, z1, z0 );
            if ( zPlus == NULL ) 
            {
                Cudd_RecursiveDerefZdd( dd, zRes );
                return NULL;
            }
            cuddRef( zPlus );

            // add these to the result
            zRes = cuddZddUnion( dd, zTemp = zRes, zPlus );
            if ( zRes == NULL )
            {
                Cudd_RecursiveDerefZdd( dd, zTemp );
                Cudd_RecursiveDerefZdd( dd, zPlus );
                return NULL;
            }
            cuddRef( zRes );
            Cudd_RecursiveDerefZdd( dd, zTemp );
            Cudd_RecursiveDerefZdd( dd, zPlus );
        

            // create the positive singleton
            zPlus = cuddZddGetNode( dd, 2*bVarsNew->index, z1, z0 );
            if ( zPlus == NULL ) 
            {
                Cudd_RecursiveDerefZdd( dd, zRes );
                return NULL;
            }
            cuddRef( zPlus );

            // add these to the result
            zRes = cuddZddUnion( dd, zTemp = zRes, zPlus );
            if ( zRes == NULL )
            {
                Cudd_RecursiveDerefZdd( dd, zTemp );
                Cudd_RecursiveDerefZdd( dd, zPlus );
                return NULL;
            }
            cuddRef( zRes );
            Cudd_RecursiveDerefZdd( dd, zTemp );
            Cudd_RecursiveDerefZdd( dd, zPlus );
        }
        cuddDeref( zRes );

        /* insert the result into cache */
        cuddCacheInsert2(dd, extraZddUnateInfoCompute, bFunc, bVars, zRes);
        return zRes;
    }
}